

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestream.cpp
# Opt level: O1

char * __thiscall
icu_63::CheckedArrayByteSink::GetAppendBuffer
          (CheckedArrayByteSink *this,int32_t min_capacity,int32_t param_2,char *scratch,
          int32_t scratch_capacity,int32_t *result_capacity)

{
  int iVar1;
  
  if (min_capacity < 1 || scratch_capacity < min_capacity) {
    *result_capacity = 0;
    return (char *)0x0;
  }
  iVar1 = this->capacity_ - this->size_;
  if (iVar1 < min_capacity) {
    *result_capacity = scratch_capacity;
    return scratch;
  }
  *result_capacity = iVar1;
  return this->outbuf_ + this->size_;
}

Assistant:

char* CheckedArrayByteSink::GetAppendBuffer(int32_t min_capacity,
                                            int32_t /*desired_capacity_hint*/,
                                            char* scratch,
                                            int32_t scratch_capacity,
                                            int32_t* result_capacity) {
  if (min_capacity < 1 || scratch_capacity < min_capacity) {
    *result_capacity = 0;
    return NULL;
  }
  int32_t available = capacity_ - size_;
  if (available >= min_capacity) {
    *result_capacity = available;
    return outbuf_ + size_;
  } else {
    *result_capacity = scratch_capacity;
    return scratch;
  }
}